

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

bool TestConstExpr::NotEqualTest<unsigned_long_long,short>(void)

{
  bool bVar1;
  uint in_stack_ffffffffffffffa8;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined2 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffbc;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffffc0;
  
  rhs.m_int = (short)((uint)in_stack_ffffffffffffffbc >> 0x10);
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  ::SafeInt<int>((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                  *)in_stack_ffffffffffffffb0.m_int,
                 (int *)CONCAT17(in_stack_ffffffffffffffaf,
                                 CONCAT16(in_stack_ffffffffffffffae,
                                          CONCAT24(in_stack_ffffffffffffffac,
                                                   in_stack_ffffffffffffffa8))));
  bVar1 = ::operator!=(CONCAT11(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffae),
                       in_stack_ffffffffffffffb0);
  uVar2 = in_stack_ffffffffffffffa8 & 0xffffff;
  uVar4 = uVar2;
  if (bVar1) {
    SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
    ::SafeInt<int>((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                    *)in_stack_ffffffffffffffb0.m_int,
                   (int *)(CONCAT17(in_stack_ffffffffffffffaf,
                                    CONCAT16(in_stack_ffffffffffffffae,
                                             CONCAT24(in_stack_ffffffffffffffac,
                                                      in_stack_ffffffffffffffa8))) &
                          0xffffffff00ffffff));
    bVar1 = ::operator!=(in_stack_ffffffffffffffb0,
                         CONCAT11(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffae));
    uVar3 = uVar2 & 0xffffff;
    uVar4 = uVar3;
    if (bVar1) {
      SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
      ::SafeInt<int>((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)in_stack_ffffffffffffffb0.m_int,
                     (int *)(CONCAT17(in_stack_ffffffffffffffaf,
                                      CONCAT16(in_stack_ffffffffffffffae,
                                               CONCAT24(in_stack_ffffffffffffffac,uVar2))) &
                            0xffffffff00ffffff));
      SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
      SafeInt<int>((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                    *)in_stack_ffffffffffffffb0.m_int,
                   (int *)CONCAT17(in_stack_ffffffffffffffaf,
                                   CONCAT16(in_stack_ffffffffffffffae,
                                            CONCAT24(in_stack_ffffffffffffffac,uVar3))));
      bVar1 = ::operator!=(in_stack_ffffffffffffffc0,rhs);
      uVar2 = uVar3 & 0xffffff;
      uVar4 = uVar2;
      if (bVar1) {
        SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
        ::SafeInt<int>((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)in_stack_ffffffffffffffb0.m_int,
                       (int *)(CONCAT17(in_stack_ffffffffffffffaf,
                                        CONCAT16(in_stack_ffffffffffffffae,
                                                 CONCAT24(in_stack_ffffffffffffffac,uVar3))) &
                              0xffffffff00ffffff));
        bVar1 = ::operator!=((bool)in_stack_ffffffffffffffaf,in_stack_ffffffffffffffb0);
        uVar4 = 0;
        if (bVar1) {
          bVar1 = false;
          SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
          ::SafeInt<int>((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                          *)in_stack_ffffffffffffffb0.m_int,
                         (int *)((ulong)uVar2 & 0xffffffff00ffffff));
          bVar1 = ::operator!=(bVar1,in_stack_ffffffffffffffb0);
          uVar4 = (uint)bVar1 << 0x18;
        }
      }
    }
  }
  return SUB41(uVar4 >> 0x18,0);
}

Assistant:

SAFEINT_CONSTEXPR11 bool NotEqualTest()
	{
		return
			(U)2 != SafeInt<T>(3) &&
			SafeInt<T>(4) != (U)5 &&
			SafeInt<T>(6) != SafeInt<U>(7) &&
			true != SafeInt<T>(1) &&
			false != SafeInt<T>(0);
	}